

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIFactoredRewardDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
TOIFactoredRewardDecPOMDPDiscrete::SetIndividualRewardModel
          (TOIFactoredRewardDecPOMDPDiscrete *this,RewardModel *rewardModel,Index agentID)

{
  long lVar1;
  undefined1 *this_00;
  
  lVar1 = *(long *)&(this->super_TOIDecPOMDPDiscrete).field_0x2c0;
  if ((ulong)(*(long *)&this->field_0x2c8 - lVar1 >> 3) <= (ulong)agentID) {
    this_00 = &(this->super_TOIDecPOMDPDiscrete).field_0x2c0;
    std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::resize
              ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)this_00,(ulong)(agentID + 1)
              );
    lVar1 = *(long *)this_00;
  }
  *(RewardModel **)(lVar1 + (ulong)agentID * 8) = rewardModel;
  return;
}

Assistant:

void TOIFactoredRewardDecPOMDPDiscrete::
SetIndividualRewardModel(RewardModel* rewardModel,
                         Index agentID)
{
    if(_m_p_rModels.size()<=agentID)
        _m_p_rModels.resize(agentID+1);

    _m_p_rModels[agentID]=rewardModel;
}